

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

double __thiscall Json::Value::asDouble(Value *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  double val;
  ostringstream oss;
  string local_1a8;
  string local_188 [3];
  ios_base local_118 [264];
  
  switch(this->field_0x8) {
  case 1:
  case 3:
    local_1a8._M_dataplus._M_p = (pointer)(double)(this->value_).int_;
    break;
  case 2:
    local_1a8._M_dataplus._M_p =
         (pointer)(((double)CONCAT44(0x45300000,(int)((ulong)(this->value_).int_ >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)(this->value_).int_) - 4503599627370496.0));
    break;
  case 4:
    local_1a8._M_dataplus._M_p = (pointer)(this->value_).int_;
    break;
  case 5:
    asString_abi_cxx11_(local_188,this);
    bVar1 = convertToDouble(local_188[0]._M_dataplus._M_p,(double *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188[0]._M_dataplus._M_p != &local_188[0].field_2) {
      operator_delete(local_188[0]._M_dataplus._M_p);
    }
    if (!bVar1) goto switchD_00142091_default;
    break;
  case 6:
    if ((this->value_).bool_ != false) {
      return 1.0;
    }
  case 0:
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    break;
  default:
switchD_00142091_default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"Value is not convertible to double.",0x23);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base(local_118);
    _Unwind_Resume(extraout_RAX);
  }
  return (double)local_1a8._M_dataplus._M_p;
}

Assistant:

double Value::asDouble() const {
  switch (type_) {
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    return static_cast<double>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<double>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return integerToDouble(value_.uint_);
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return value_.real_;
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0 : 0.0;
  case stringValue: {
    double val;

    if (!convertToDouble(asString().c_str(), &val)) {
      break;
    }

    return val;
  }
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to double.");
}